

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O3

bool __thiscall ConditionalEstimator::hasAdditionalEvents(ConditionalEstimator *this)

{
  int iVar1;
  bool *pbVar2;
  int iVar3;
  bool bVar4;
  int local_2c;
  
  if (this->bRejection != true) {
    return false;
  }
  iVar3 = this->aRejectionInterval[0];
  bVar4 = true;
  iVar1 = this->aRejectionInterval[1];
  if (iVar1 != -iVar3 && SBORROW4(iVar1,-iVar3) == iVar1 + iVar3 < 0) {
    iVar3 = -iVar3;
    iVar1 = -1;
    do {
      iVar3 = iVar3 + 1;
      local_2c = this->nPre + iVar3 + -2;
      pbVar2 = Ring<bool>::operator[](&this->condEventRing,&local_2c);
      bVar4 = SCARRY4((uint)*pbVar2,iVar1);
      iVar1 = (uint)*pbVar2 + iVar1;
      if (iVar1 != 0 && bVar4 == iVar1 < 0) break;
    } while (iVar3 < this->aRejectionInterval[1]);
    bVar4 = iVar1 != 0;
  }
  return bVar4;
}

Assistant:

bool ConditionalEstimator::hasAdditionalEvents()
{
	if (!bRejection)
		return false;
	else {
		int events = -1;
		for (int i=-aRejectionInterval[0]; events<1 && i<aRejectionInterval[1]; ++i)
			events += condEventRing[nPre+1-2+i];
		return events;
	}
}